

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O0

void randomx_calculate_hash_next
               (randomx_vm *machine,void *nextInput,size_t nextInputSize,void *output)

{
  undefined8 in_RCX;
  randomx_vm *in_RDI;
  uint32_t chain;
  size_t in_stack_000000b8;
  void *in_stack_000000c0;
  size_t in_stack_000000c8;
  void *in_stack_000000d0;
  size_t in_stack_000000d8;
  void *in_stack_000000e0;
  uint local_24;
  
  randomx_vm::resetRoundingMode((randomx_vm *)0x122802);
  for (local_24 = 0; local_24 < 7; local_24 = local_24 + 1) {
    (*in_RDI->_vptr_randomx_vm[8])(in_RDI,in_RDI->tempHash);
    randomx_vm::getRegisterFile(in_RDI);
    randomx_blake2b(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                    in_stack_000000c0,in_stack_000000b8);
  }
  (*in_RDI->_vptr_randomx_vm[8])(in_RDI,in_RDI->tempHash);
  randomx_blake2b(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                  in_stack_000000c0,in_stack_000000b8);
  (*in_RDI->_vptr_randomx_vm[4])(in_RDI,in_RCX,0x20,in_RDI->tempHash);
  return;
}

Assistant:

void randomx_calculate_hash_next(randomx_vm* machine, const void* nextInput, size_t nextInputSize, void* output) {
		machine->resetRoundingMode();
		for (uint32_t chain = 0; chain < RANDOMX_PROGRAM_COUNT - 1; ++chain) {
			machine->run(machine->tempHash);
			blake2b(machine->tempHash, sizeof(machine->tempHash), machine->getRegisterFile(), sizeof(randomx::RegisterFile), nullptr, 0);
		}
		machine->run(machine->tempHash);

		// Finish current hash and fill the scratchpad for the next hash at the same time
		blake2b(machine->tempHash, sizeof(machine->tempHash), nextInput, nextInputSize, nullptr, 0);
		machine->hashAndFill(output, RANDOMX_HASH_SIZE, machine->tempHash);
	}